

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O3

FFSTypeHandle_conflict FFSread_format(FFSFile ffsfile)

{
  FFSRecordType FVar1;
  int iVar2;
  FFSBuffer p_Var3;
  char *server_id;
  char *server_rep;
  FMFormat_conflict p_Var4;
  FFSTypeHandle_conflict p_Var5;
  uint *puVar6;
  
  if (ffsfile->read_ahead != 0) goto LAB_00117501;
  while( true ) {
    while( true ) {
      next_record_type(ffsfile);
LAB_00117501:
      FVar1 = ffsfile->next_record_type;
      if (FVar1 != FFSdata) break;
      if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
        p_Var3 = create_FFSBuffer();
        ffsfile->tmp_buffer = p_Var3;
      }
      FFSread(ffsfile,(void *)0x0);
    }
    if (FVar1 != FFScomment) break;
    if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
      p_Var3 = create_FFSBuffer();
      ffsfile->tmp_buffer = p_Var3;
    }
    FFSread_comment(ffsfile);
  }
  if (FVar1 == FFSformat) {
    server_id = (char *)ffs_malloc((long)ffsfile->next_fid_len);
    server_rep = (char *)ffs_malloc(ffsfile->next_data_len);
    iVar2 = (*ffsfile->read_func)
                      (ffsfile->file_id,server_id,(long)ffsfile->next_fid_len,(int *)0x0,
                       (char **)0x0);
    if ((iVar2 == ffsfile->next_fid_len) &&
       (iVar2 = (*ffsfile->read_func)
                          (ffsfile->file_id,server_rep,ffsfile->next_data_len,(int *)0x0,
                           (char **)0x0), ffsfile->next_data_len == (long)iVar2)) {
      ffsfile->read_ahead = 0;
      p_Var4 = load_external_format_FMcontext
                         (ffsfile->c->fmc,server_id,ffsfile->next_fid_len,server_rep);
      free(server_id);
      p_Var5 = FFSTypeHandle_by_index(ffsfile->c,p_Var4->format_index);
      init_format_info(ffsfile,p_Var4->format_index);
      ffsfile->info[p_Var4->format_index].written_to_file = 1;
      return p_Var5;
    }
    puVar6 = (uint *)__errno_location();
    printf("Read failed, errno %d\n",(ulong)*puVar6);
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern FFSTypeHandle
FFSread_format(FFSFile ffsfile)
{
    char *id;
    char *rep;
    FMFormat format;
    FFSTypeHandle handle;
    if (ffsfile->read_ahead == FALSE) {
	(void) next_record_type(ffsfile);
    }
    while (ffsfile->next_record_type != FFSformat) {
	switch (ffsfile->next_record_type) {
	case FFScomment:
	    if (ffsfile->tmp_buffer == NULL) {
		ffsfile->tmp_buffer = create_FFSBuffer();
	    }
	    (void) FFSread_comment(ffsfile);
	    (void) next_record_type(ffsfile);
	    break;
	case FFSdata:
	    if (ffsfile->tmp_buffer == NULL) {
		ffsfile->tmp_buffer = create_FFSBuffer();
	    }
	    (void) FFSread(ffsfile, NULL);
	    (void) next_record_type(ffsfile);
	    break;
	default:
	    return NULL;
	}
    }
    
    id = malloc(ffsfile->next_fid_len);
    rep = malloc(ffsfile->next_data_len);
    if (ffsfile->read_func(ffsfile->file_id, id, 
			   ffsfile->next_fid_len, NULL, NULL)
	!= ffsfile->next_fid_len) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    if (ffsfile->read_func(ffsfile->file_id, rep, 
			   ffsfile->next_data_len, NULL, NULL)
	!= ffsfile->next_data_len) {
	printf("Read failed, errno %d\n", errno);
	return NULL;
    }
    ffsfile->read_ahead = FALSE;
    format = load_external_format_FMcontext(ffsfile->c->fmc, id, 
					    ffsfile->next_fid_len, rep);
    free(id);
    handle = FFSTypeHandle_by_index(ffsfile->c, format->format_index);

    /* in case we're in append mode, mark this as ready in the file */
    init_format_info(ffsfile, format->format_index);
    ffsfile->info[format->format_index].written_to_file = 1;
    return handle;
}